

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O2

void __thiscall CompileCommandParser::ExpectOrDie(CompileCommandParser *this,char c,string *message)

{
  bool bVar1;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Expect(this,c);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\'",&local_c1);
    std::operator+(&local_c0,&local_40,c);
    std::operator+(&local_a0,&local_c0,"\' expected ");
    std::operator+(&local_80,&local_a0,message);
    std::operator+(&local_60,&local_80,".");
    ErrorExit(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void ExpectOrDie(char c, const std::string& message)
  {
    if (!Expect(c)) {
      ErrorExit(std::string("'") + c + "' expected " + message + ".");
    }
  }